

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::FieldMask::_InternalSerialize
          (FieldMask *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  _func_int **pp_Var1;
  FieldMask *this_00;
  ptrdiff_t pVar2;
  uint32_t num;
  bool bVar3;
  uint uVar4;
  int iVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  WireFormatLite *this_02;
  void *__src;
  UnknownFieldSet *unknown_fields;
  byte *__dest;
  char *in_R9;
  string_view sVar6;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  const_reference local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  int local_80;
  int n;
  int i;
  uint32_t cached_has_bits;
  FieldMask *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  FieldMask *this_local;
  char *local_50;
  size_t local_48;
  ptrdiff_t size;
  const_reference local_38;
  uint32_t local_2c;
  FieldMask *local_28;
  EpsCopyOutputStream *local_20;
  byte *local_18;
  uint local_c;
  
  n = 0;
  local_80 = 0;
  _i = this;
  this_ = (FieldMask *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  s._4_4_ = _internal_paths_size(this);
  for (; local_80 < s._4_4_; local_80 = local_80 + 1) {
    this_01 = _internal_paths_abi_cxx11_(_i);
    local_90 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Get(this_01,local_80);
    this_02 = (WireFormatLite *)std::__cxx11::string::data();
    uVar4 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_a0,"google.protobuf.FieldMask.paths");
    sVar6._M_str = in_R9;
    sVar6._M_len = (size_t)local_a0._M_str;
    internal::WireFormatLite::VerifyUtf8String
              (this_02,(char *)(ulong)uVar4,1,(Operation)local_a0._M_len,sVar6);
    this_00 = this_;
    local_28 = this_;
    local_2c = 1;
    local_38 = local_90;
    size = (ptrdiff_t)stream_local;
    local_48 = std::__cxx11::string::size();
    pVar2 = size;
    bVar3 = true;
    if ((long)local_48 < 0x80) {
      pp_Var1 = (this_00->super_Message).super_MessageLite._vptr_MessageLite;
      iVar5 = protobuf::io::EpsCopyOutputStream::TagSize(local_2c << 3);
      bVar3 = (long)pp_Var1 + (-(long)iVar5 - pVar2) + 0xf < (long)local_48;
    }
    num = local_2c;
    if (bVar3) {
      sVar6 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
      local_50 = sVar6._M_str;
      this_local = (FieldMask *)sVar6._M_len;
      local_20 = (EpsCopyOutputStream *)
                 protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           ((EpsCopyOutputStream *)this_00,num,sVar6,(uint8_t *)size);
    }
    else {
      local_18 = (byte *)size;
      for (local_c = local_2c << 3 | 2; 0x7f < local_c; local_c = local_c >> 7) {
        *local_18 = (byte)local_c | 0x80;
        local_18 = local_18 + 1;
      }
      *local_18 = (byte)local_c;
      __dest = local_18 + 2;
      local_18[1] = (byte)local_48;
      size = (ptrdiff_t)__dest;
      local_18 = local_18 + 1;
      __src = (void *)std::__cxx11::string::data();
      memcpy(__dest,__src,local_48);
      local_20 = (EpsCopyOutputStream *)(size + local_48);
    }
    stream_local = local_20;
  }
  bVar3 = internal::InternalMetadata::have_unknown_fields
                    (&(_i->super_Message).super_MessageLite._internal_metadata_);
  if (bVar3) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(_i->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FieldMask::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FieldMask& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldMask)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated string paths = 1;
  for (int i = 0, n = this_._internal_paths_size(); i < n; ++i) {
    const auto& s = this_._internal_paths().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "google.protobuf.FieldMask.paths");
    target = stream->WriteString(1, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldMask)
  return target;
}